

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void __thiscall
GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Vector::grow(Vector *this,uint newSize)

{
  void **__dest;
  void **newData;
  uint newSize_local;
  Vector *this_local;
  
  if (newSize < this->max + (this->max >> 1)) {
    newData._4_4_ = this->max + (this->max >> 1);
  }
  else {
    newData._4_4_ = newSize + 0x20;
  }
  __dest = NULLC::construct<void*>(newData._4_4_);
  if (this->data != (void **)0x0) {
    memcpy(__dest,this->data,(ulong)this->max << 3);
    NULLC::destruct<void*>(this->data,(ulong)this->max);
  }
  this->data = __dest;
  this->max = newData._4_4_;
  return;
}

Assistant:

void grow(unsigned newSize)
		{
			if(max + (max >> 1) > newSize)
				newSize = max + (max >> 1);
			else
				newSize += 32;

			void **newData;

			newData = NULLC::construct<void*>(newSize);

			if(data)
			{
				memcpy(newData, data, max * sizeof(void*));

				NULLC::destruct(data, max);
			}

			data = newData;
			max = newSize;
		}